

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O3

int Cudd_bddGenConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  DdManager *pDVar2;
  int iVar3;
  int iVar4;
  st__table *table;
  char *value;
  NodeStat *pNVar5;
  st__generator *psVar6;
  long lVar7;
  st__table *ghTable;
  Conjuncts *pCVar8;
  DdNode **ppDVar9;
  DdNode *n;
  DdNode *pDVar10;
  st__table *mintermTable;
  double dVar11;
  st__table *local_78;
  Conjuncts *local_70;
  DdNode *local_68;
  DdManager *local_60;
  DdNode ***local_58;
  Conjuncts *local_50;
  int local_44;
  ulong local_40;
  char *key;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  local_40 = (ulong)f & 0xfffffffffffffffe;
  local_68 = f;
  local_60 = dd;
  local_58 = conjuncts;
  do {
    while( true ) {
      pDVar2 = local_60;
      local_60->reordered = 0;
      table = st__init_table(st__ptrcmp,st__ptrhash);
      if (table != (st__table *)0x0) break;
      ghTable = (st__table *)0x0;
      mintermTable = (st__table *)0x0;
      local_78 = (st__table *)0x0;
      table = (st__table *)0x0;
LAB_0077ecc9:
      do {
        if (table != (st__table *)0x0) {
          do {
            psVar6 = st__init_gen(table);
          } while (psVar6 == (st__generator *)0x0);
          while (iVar3 = st__gen(psVar6,&key,(char **)&local_70), iVar3 != 0) {
            if (local_70 != (Conjuncts *)0x0) {
              free(local_70);
              local_70 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar6);
          st__free_table(table);
        }
        if (mintermTable != (st__table *)0x0) {
          psVar6 = st__init_gen(mintermTable);
          table = (st__table *)0x0;
          if (psVar6 == (st__generator *)0x0) goto LAB_0077ecc9;
          while (iVar3 = st__gen(psVar6,&key,(char **)&local_70), iVar3 != 0) {
            if (local_70 != (Conjuncts *)0x0) {
              free(local_70);
              local_70 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar6);
          st__free_table(mintermTable);
        }
        if (ghTable != (st__table *)0x0) {
          st__free_table(ghTable);
        }
        if (local_78 == (st__table *)0x0) goto LAB_0077edeb;
        psVar6 = st__init_gen(local_78);
        mintermTable = (st__table *)0x0;
        table = (st__table *)0x0;
      } while (psVar6 == (st__generator *)0x0);
      iVar3 = st__gen(psVar6,&key,(char **)&local_70);
      pDVar2 = local_60;
      while (iVar3 != 0) {
        ConjunctsFree(pDVar2,local_70);
        iVar3 = st__gen(psVar6,&key,(char **)&local_70);
      }
      st__free_gen(psVar6);
      st__free_table(local_78);
LAB_0077edeb:
      local_60->errorCode = CUDD_MEMORY_OUT;
      if (local_60->reordered != 1) {
        return 0;
      }
    }
    value = (char *)malloc(8);
    if (value == (char *)0x0) {
LAB_0077ecbc:
      ghTable = (st__table *)0x0;
      mintermTable = (st__table *)0x0;
      local_78 = (st__table *)0x0;
      goto LAB_0077ecc9;
    }
    value[0] = '\0';
    value[1] = '\0';
    value[2] = '\0';
    value[3] = '\0';
    value[4] = '\x01';
    value[5] = '\0';
    value[6] = '\0';
    value[7] = '\0';
    iVar3 = st__insert(table,(char *)one,value);
    if ((iVar3 == -10000) || (pNVar5 = CreateBotDist(local_68,table), pNVar5 == (NodeStat *)0x0))
    goto LAB_0077ecbc;
    iVar3 = pNVar5->distance;
    iVar4 = 5;
    if (5 < iVar3) {
      iVar4 = iVar3;
    }
    if (4 < iVar3) {
      local_50 = (Conjuncts *)CONCAT44(local_50._4_4_,iVar4);
      psVar6 = st__init_gen(table);
      if (psVar6 != (st__generator *)0x0) {
        iVar4 = st__gen(psVar6,&key,(char **)&local_70);
        iVar3 = 0;
        while (iVar4 != 0) {
          iVar4 = *(int *)((long)&local_70->g + 4);
          if (iVar3 < iVar4) {
            iVar3 = iVar4;
          }
          iVar4 = st__gen(psVar6,&key,(char **)&local_70);
        }
        local_44 = iVar3;
        st__free_gen(psVar6);
        pDVar10 = local_68;
        iVar3 = Cudd_SupportSize(pDVar2,local_68);
        dVar11 = ldexp(1.0,iVar3);
        mintermTable = st__init_table(st__ptrcmp,st__ptrhash);
        if (mintermTable != (st__table *)0x0) {
          dVar11 = CountMinterms(pDVar10,dVar11,mintermTable,pDVar2->err);
          if ((dVar11 != -1.0) || (NAN(dVar11))) {
            lVar7 = Cudd_Random();
            lastTimeG = (long)((uint)lVar7 & 1);
            local_78 = st__init_table(st__ptrcmp,st__ptrhash);
            if (local_78 != (st__table *)0x0) {
              ghTable = st__init_table(st__ptrcmp,st__ptrhash);
              if (ghTable == (st__table *)0x0) {
                ghTable = (st__table *)0x0;
              }
              else {
                pCVar8 = BuildConjuncts(local_60,local_68,table,local_78,(int)local_50,local_44,
                                        ghTable,mintermTable);
                if ((pCVar8 != (Conjuncts *)0x0) &&
                   (local_50 = pCVar8, psVar6 = st__init_gen(table), psVar6 != (st__generator *)0x0)
                   ) {
                  while (iVar3 = st__gen(psVar6,&key,(char **)&local_70), iVar3 != 0) {
                    if (local_70 != (Conjuncts *)0x0) {
                      free(local_70);
                      local_70 = (Conjuncts *)0x0;
                    }
                  }
                  st__free_gen(psVar6);
                  st__free_table(table);
                  st__free_table(ghTable);
                  psVar6 = st__init_gen(mintermTable);
                  if (psVar6 == (st__generator *)0x0) {
                    ghTable = (st__table *)0x0;
                    table = (st__table *)0x0;
                  }
                  else {
                    while (iVar3 = st__gen(psVar6,&key,(char **)&local_70), iVar3 != 0) {
                      if (local_70 != (Conjuncts *)0x0) {
                        free(local_70);
                        local_70 = (Conjuncts *)0x0;
                      }
                    }
                    st__free_gen(psVar6);
                    st__free_table(mintermTable);
                    pCVar8 = local_50;
                    if (((ulong)local_50 & 1) != 0) {
                      pCVar8 = (Conjuncts *)((ulong)local_50 ^ 1);
                    }
                    if (pCVar8 == (Conjuncts *)0x0) {
                      pDVar10 = (DdNode *)0x0;
                      n = (DdNode *)0x0;
                    }
                    else {
                      pDVar10 = pCVar8->g;
                      n = pCVar8->h;
                      piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                      *piVar1 = *piVar1 + 1;
                      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
                      *piVar1 = *piVar1 + 1;
                      if (((ulong)local_50 & 1) != 0) {
                        free((Conjuncts *)((ulong)local_50 ^ 1));
                      }
                    }
                    psVar6 = st__init_gen(local_78);
                    if (psVar6 != (st__generator *)0x0) {
                      iVar3 = st__gen(psVar6,&key,(char **)&local_70);
                      pDVar2 = local_60;
                      while (table = local_78, iVar3 != 0) {
                        ConjunctsFree(pDVar2,local_70);
                        iVar3 = st__gen(psVar6,&key,(char **)&local_70);
                      }
                      goto LAB_0077ec05;
                    }
                    ghTable = (st__table *)0x0;
                    mintermTable = (st__table *)0x0;
                    table = (st__table *)0x0;
                  }
                }
              }
              goto LAB_0077ecc9;
            }
          }
          ghTable = (st__table *)0x0;
          local_78 = (st__table *)0x0;
          goto LAB_0077ecc9;
        }
      }
      goto LAB_0077ecbc;
    }
    n = pDVar2->one;
    *(int *)(local_40 + 4) = *(int *)(local_40 + 4) + 1;
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    psVar6 = st__init_gen(table);
    if (psVar6 == (st__generator *)0x0) goto LAB_0077ecbc;
    while (iVar3 = st__gen(psVar6,&key,(char **)&local_70), pDVar10 = local_68, iVar3 != 0) {
      if (local_70 != (Conjuncts *)0x0) {
        free(local_70);
        local_70 = (Conjuncts *)0x0;
      }
    }
LAB_0077ec05:
    st__free_gen(psVar6);
    st__free_table(table);
    pDVar2 = local_60;
    if (local_60->reordered != 1) {
      if (pDVar10 == one) {
        Cudd_RecursiveDeref(local_60,pDVar10);
        ppDVar9 = (DdNode **)malloc(8);
        *local_58 = ppDVar9;
        pDVar10 = n;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = n;
          return 1;
        }
      }
      else if (n == one) {
        Cudd_RecursiveDeref(local_60,n);
        ppDVar9 = (DdNode **)malloc(8);
        *local_58 = ppDVar9;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = pDVar10;
          return 1;
        }
      }
      else {
        ppDVar9 = (DdNode **)malloc(0x10);
        *local_58 = ppDVar9;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = pDVar10;
          ppDVar9[1] = n;
          return 2;
        }
        Cudd_RecursiveDeref(pDVar2,pDVar10);
        pDVar10 = n;
      }
      Cudd_RecursiveDeref(pDVar2,pDVar10);
      pDVar2->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
  } while( true );
}

Assistant:

int
Cudd_bddGenConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int result;
    DdNode *glocal, *hlocal;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    
    do {
        dd->reordered = 0;
        result = cuddConjunctsAux(dd, f, &glocal, &hlocal);
    } while (dd->reordered == 1);

    if (result == 0) {
        return(0);
    }

    if (glocal != one) {
        if (hlocal != one) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}